

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O2

size_t __thiscall AutoFile::detail_fread(AutoFile *this,Span<std::byte> dst)

{
  long lVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_t sVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  Span<const_std::byte> key;
  Span<std::byte> write;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((FILE *)this->m_file == (FILE *)0x0) {
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar5,(error_code *)"AutoFile::read: file handle is nullptr");
LAB_00b0cea5:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    sVar4 = fread(dst.m_data,1,dst.m_size,(FILE *)this->m_file);
    pbVar2 = (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar3 = (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar2 != pbVar3) {
      if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == false) {
        pcVar5 = (char *)__cxa_allocate_exception(0x20);
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar5,(error_code *)"AutoFile::read: position unknown");
        goto LAB_00b0cea5;
      }
      key.m_size = (long)pbVar3 - (long)pbVar2;
      key.m_data = pbVar2;
      write.m_size = sVar4;
      write.m_data = dst.m_data;
      util::Xor(write,key,
                (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_payload._M_value);
    }
    if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value =
           (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload._M_value + sVar4;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return sVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::size_t AutoFile::detail_fread(Span<std::byte> dst)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::read: file handle is nullptr");
    size_t ret = std::fread(dst.data(), 1, dst.size(), m_file);
    if (!m_xor.empty()) {
        if (!m_position.has_value()) throw std::ios_base::failure("AutoFile::read: position unknown");
        util::Xor(dst.subspan(0, ret), m_xor, *m_position);
    }
    if (m_position.has_value()) *m_position += ret;
    return ret;
}